

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileMtlImporter.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileMtlImporter::createMaterial(ObjFileMtlImporter *this)

{
  mapped_type pMVar1;
  bool bVar2;
  uint uVar3;
  reference pcVar4;
  Material *this_00;
  mapped_type *ppMVar5;
  size_type sVar6;
  reference ppVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  _Self local_138;
  _Self local_130;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8 [32];
  long local_c8;
  size_t first_non_ws_pos;
  size_t first_ws_pos;
  undefined1 local_b0 [8];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  uint local_64;
  undefined1 local_60 [4];
  uint numToken;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  token;
  allocator local_31;
  undefined1 local_30 [8];
  string line;
  ObjFileMtlImporter *this_local;
  
  line.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  while( true ) {
    pcVar4 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&this->m_DataIt);
    bVar2 = IsLineEnd<char>(*pcVar4);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pcVar4 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&this->m_DataIt);
    std::__cxx11::string::operator+=((string *)local_30,*pcVar4);
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
              (&this->m_DataIt);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_88," \t",(allocator *)(name.field_2._M_local_buf + 0xf));
  uVar3 = tokenize<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_60,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
  local_64 = uVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b0,"",(allocator *)((long)&first_ws_pos + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&first_ws_pos + 7));
  if (local_64 == 1) {
    std::__cxx11::string::operator=((string *)local_b0,"DefaultMaterial");
  }
  else {
    first_non_ws_pos = std::__cxx11::string::find_first_of(local_30,0xb719b0);
    local_c8 = std::__cxx11::string::find_first_not_of(local_30,0xb719b0);
    if (local_c8 != -1) {
      std::__cxx11::string::substr((ulong)local_e8,(ulong)local_30);
      std::__cxx11::string::operator=((string *)local_b0,local_e8);
      std::__cxx11::string::~string(local_e8);
    }
  }
  std::__cxx11::string::string((string *)&it,(string *)local_b0);
  trim_whitespaces<std::__cxx11::string>(&local_108,(Assimp *)&it,str);
  std::__cxx11::string::operator=((string *)local_b0,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&it);
  local_130._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
       ::find(&this->m_pModel->m_MaterialMap,(key_type *)local_b0);
  local_138._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
       ::end(&this->m_pModel->m_MaterialMap);
  bVar2 = std::operator==(&local_138,&local_130);
  if (bVar2) {
    this_00 = (Material *)operator_new(0x409c);
    ObjFile::Material::Material(this_00);
    this->m_pModel->m_pCurrentMaterial = this_00;
    aiString::Set(&this->m_pModel->m_pCurrentMaterial->MaterialName,(string *)local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_pModel->m_MaterialLib,(value_type *)local_b0);
    pMVar1 = this->m_pModel->m_pCurrentMaterial;
    ppMVar5 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
              ::operator[](&this->m_pModel->m_MaterialMap,(key_type *)local_b0);
    *ppMVar5 = pMVar1;
    if (this->m_pModel->m_pCurrentMesh != (Mesh *)0x0) {
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->m_pModel->m_MaterialLib);
      this->m_pModel->m_pCurrentMesh->m_uiMaterialIndex = (int)sVar6 - 1;
    }
  }
  else {
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>
             ::operator*(&local_130);
    this->m_pModel->m_pCurrentMaterial = ppVar7->second;
  }
  std::__cxx11::string::~string((string *)local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void ObjFileMtlImporter::createMaterial()
{
    std::string line( "" );
    while( !IsLineEnd( *m_DataIt ) ) {
        line += *m_DataIt;
        ++m_DataIt;
    }

    std::vector<std::string> token;
    const unsigned int numToken = tokenize<std::string>( line, token, " \t" );
    std::string name( "" );
    if ( numToken == 1 ) {
        name = AI_DEFAULT_MATERIAL_NAME;
    } else {
        // skip newmtl and all following white spaces
        std::size_t first_ws_pos = line.find_first_of(" \t");
        std::size_t first_non_ws_pos = line.find_first_not_of(" \t", first_ws_pos);
        if (first_non_ws_pos != std::string::npos) {
            name = line.substr(first_non_ws_pos);
        }
    }

    name = trim_whitespaces(name);

    std::map<std::string, ObjFile::Material*>::iterator it = m_pModel->m_MaterialMap.find( name );
    if ( m_pModel->m_MaterialMap.end() == it) {
        // New Material created
        m_pModel->m_pCurrentMaterial = new ObjFile::Material();
        m_pModel->m_pCurrentMaterial->MaterialName.Set( name );
        m_pModel->m_MaterialLib.push_back( name );
        m_pModel->m_MaterialMap[ name ] = m_pModel->m_pCurrentMaterial;

        if (m_pModel->m_pCurrentMesh) {
            m_pModel->m_pCurrentMesh->m_uiMaterialIndex = static_cast<unsigned int>(m_pModel->m_MaterialLib.size() - 1);
        }
    } else {
        // Use older material
        m_pModel->m_pCurrentMaterial = (*it).second;
    }
}